

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O3

void XPMP2::RemoteCleanup(void)

{
  RmtStopAll();
  if (gpMc != (long *)0x0) {
    (**(code **)(*gpMc + 8))();
    gpMc = (long *)0x0;
  }
  if (gMsgAcDetail != (void *)0x0) {
    free(gMsgAcDetail);
  }
  gMsgAcDetail = (void *)0x0;
  uRam00000000002ec348 = 0;
  _DAT_002ec350 = 0;
  return;
}

Assistant:

void RemoteCleanup ()
{
    RmtStopAll();               // stop everything (multicast listening/sending, thread)
    if (gpMc) {                 // remove the multicast object
        delete gpMc;
        gpMc = nullptr;
    }
    
    // Remove all message caches
    gMsgAcDetail.free();
}